

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_statement.c
# Opt level: O0

AST * parse_finish_continue_statement(Translation_Data *translation_data)

{
  char cVar1;
  AST *hold;
  Translation_Data *translation_data_local;
  
  translation_data_local = (Translation_Data *)malloc(4);
  *(AST_Type *)&translation_data_local->tokens = ST_CONTINUE;
  cVar1 = get_and_check(translation_data,KW_SEMI_COLUMN);
  if (cVar1 == '\0') {
    push_translation_error(" \';\' expected",translation_data);
    translation_data_local = (Translation_Data *)get_error_tree((AST *)translation_data_local);
  }
  return (AST *)translation_data_local;
}

Assistant:

struct AST* parse_finish_continue_statement(struct Translation_Data* translation_data)
{
	struct AST *hold;
	hold=malloc(sizeof(struct AST));
	hold->type=ST_CONTINUE;
	if(get_and_check(translation_data,KW_SEMI_COLUMN))
	{
		return hold;
	}else
	{
		push_translation_error(" ';' expected",translation_data);
		return (struct AST*)get_error_tree(hold);
	}
}